

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O3

StringPtr capnp::operator*(undefined8 *param_1)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  ArrayPtr<const_char> AVar5;
  StructReader local_68;
  PointerReader local_38;
  
  local_38.pointer = *(WirePointer **)(*(long *)*param_1 + 8);
  local_38.segment = (SegmentReader *)0x0;
  local_38.capTable = (CapTableReader *)0x0;
  local_38.nestingLimit = 0x7fffffff;
  _::PointerReader::getStruct(&local_68,&local_38,(word *)0x0);
  local_38.pointer = (WirePointer *)0x0;
  local_38.nestingLimit = 0x7fffffff;
  if (local_68.pointerCount != 0) {
    local_38.pointer = local_68.pointers;
    local_38.nestingLimit = local_68.nestingLimit;
  }
  uVar1 = 0;
  uVar2 = 0;
  uVar3 = 0;
  uVar4 = 0;
  if (local_68.pointerCount != 0) {
    uVar1 = local_68.segment._0_4_;
    uVar2 = local_68.segment._4_4_;
    uVar3 = local_68.capTable._0_4_;
    uVar4 = local_68.capTable._4_4_;
  }
  local_38.segment = (SegmentReader *)CONCAT44(uVar2,uVar1);
  local_38.capTable = (CapTableReader *)CONCAT44(uVar4,uVar3);
  AVar5 = (ArrayPtr<const_char>)_::PointerReader::getBlob<capnp::Text>(&local_38,(void *)0x0,0);
  return (StringPtr)AVar5;
}

Assistant:

schema::Node::Reader Schema::getProto() const {
  return readMessageUnchecked<schema::Node>(raw->generic->encodedNode);
}